

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,QTextureGlyphCache::Coord>::
tryEmplace_impl<QTextureGlyphCache::GlyphAndSubPixelPosition_const&>
          (TryEmplaceResult *__return_storage_ptr__,
          QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,QTextureGlyphCache::Coord> *this,
          GlyphAndSubPixelPosition *key)

{
  uchar uVar1;
  Span *pSVar2;
  QFixed QVar3;
  Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
  *pDVar4;
  QHashMultiReturnType<unsigned_int,_int,_int> hash;
  Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> *pNVar6;
  long in_FS_OFFSET;
  Bucket BVar8;
  QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> local_48;
  int local_40;
  int local_3c;
  long local_38;
  Span *pSVar5;
  ulong uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
             **)this;
  if (pDVar4 == (Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                 *)0x0) {
    pDVar4 = QHashPrivate::
             Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
             ::detached((Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                         *)0x0);
    *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
      **)this = pDVar4;
  }
  local_48.d = (Data *)0x0;
  local_3c = (key->subPixelPosition).x.val;
  local_40 = (key->subPixelPosition).y.val;
  hash = qHashMulti<unsigned_int,int,int>(pDVar4->seed,&key->glyph,&local_3c,&local_40);
  BVar8 = QHashPrivate::
          Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
          ::findBucketWithHash<QTextureGlyphCache::GlyphAndSubPixelPosition>
                    (*(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                       **)this,key,hash);
  uVar7 = BVar8.index;
  pSVar5 = BVar8.span;
  uVar1 = pSVar5->offsets[uVar7];
  pDVar4 = *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
             **)this;
  if ((pDVar4 == (Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                  *)0x0) || (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i))
  {
    QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>::operator=
              (&local_48,
               (QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> *)
               this);
    if (uVar1 == 0xff) {
LAB_003c7ca8:
      pDVar4 = *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                 **)this;
      if (pDVar4->numBuckets >> 1 <= pDVar4->size) {
        pDVar4 = QHashPrivate::
                 Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                 ::detached(pDVar4,pDVar4->size + 1);
        *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
          **)this = pDVar4;
        BVar8 = QHashPrivate::
                Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                ::findBucketWithHash<QTextureGlyphCache::GlyphAndSubPixelPosition>(pDVar4,key,hash);
        goto LAB_003c7d25;
      }
    }
    else {
      pDVar4 = *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                 **)this;
    }
    pSVar2 = pDVar4->spans;
    pDVar4 = QHashPrivate::
             Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
             ::detached(pDVar4);
    *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
      **)this = pDVar4;
    BVar8.index._0_4_ = (uint)BVar8.index & 0x7f;
    BVar8.span = pDVar4->spans +
                 ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7);
    BVar8.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_003c7d53;
  }
  else {
    if (uVar1 != 0xff) goto LAB_003c7d53;
    if (pDVar4->numBuckets >> 1 <= pDVar4->size) {
      QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>::operator=
                (&local_48,
                 (QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> *)
                 this);
      goto LAB_003c7ca8;
    }
  }
LAB_003c7d25:
  pNVar6 = QHashPrivate::
           Span<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
           ::insert(BVar8.span,BVar8.index);
  QVar3.val = (key->subPixelPosition).x.val;
  (pNVar6->key).glyph = key->glyph;
  (pNVar6->key).subPixelPosition.x = (QFixed)QVar3.val;
  (pNVar6->key).subPixelPosition.y.val = (key->subPixelPosition).y.val;
  (pNVar6->value).x = 0;
  (pNVar6->value).y = 0;
  (pNVar6->value).w = 0;
  (pNVar6->value).h = 0;
  (pNVar6->value).baseLineX = 0;
  (pNVar6->value).baseLineY = 0;
  pDVar4 = *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
             **)this;
  pDVar4->size = pDVar4->size + 1;
LAB_003c7d53:
  pSVar5 = pDVar4->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar4;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar8.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar8.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>::~QHash(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }